

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__name;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int sock_fd;
  int res;
  addrinfo *ai;
  addrinfo hints;
  int c;
  char *rootDoc;
  char *i_index;
  char *p_port;
  int i;
  int p;
  char **argv_local;
  int argc_local;
  
  fileName = *argv;
  bVar1 = false;
  bVar2 = false;
  i_index = "8080";
  rootDoc = "index.html";
  while (hints.ai_next._4_4_ = __posix_getopt(argc,argv,"p:i:"), hints.ai_next._4_4_ != -1) {
    if (hints.ai_next._4_4_ == 0x69) {
      if (bVar2) {
        fprintf(_stderr,"USAGE:\t%s [-p PORT] [-i INDEX] DOC_ROOT\n",fileName);
        exit(1);
      }
      bVar2 = true;
      rootDoc = strdup(_optarg);
    }
    else {
      if (hints.ai_next._4_4_ != 0x70) {
        fprintf(_stderr,"USAGE:\t%s [-p PORT] [-i INDEX] DOC_ROOT\n",fileName);
        exit(1);
      }
      if (bVar1) {
        fprintf(_stderr,"USAGE:\t%s [-p PORT] [-i INDEX] DOC_ROOT\n",fileName);
        exit(1);
      }
      bVar1 = true;
      i_index = strdup(_optarg);
      iVar3 = isValidPort(i_index);
      if (iVar3 == 0) {
        fprintf(_stderr,"%s ERROR: ",fileName);
        fprintf(_stderr,"INVALID PORT");
        fprintf(_stderr,"\n");
        exit(1);
      }
    }
  }
  __name = argv[_optind];
  if (__name == (char *)0x0) {
    fprintf(_stderr,"USAGE:\t%s [-p PORT] [-i INDEX] DOC_ROOT\n",fileName);
    exit(1);
  }
  iVar3 = access(__name,4);
  if (iVar3 == -1) {
    fprintf(_stderr,"%s ERROR: ",fileName);
    fprintf(_stderr,"root doc can\'t be read from");
    fprintf(_stderr,"\n");
    exit(1);
  }
  memset(&ai,0,0x30);
  ai._4_4_ = 2;
  hints.ai_flags = 1;
  ai._0_4_ = 1;
  iVar3 = getaddrinfo((char *)0x0,i_index,(addrinfo *)&ai,(addrinfo **)&sock_fd);
  if (iVar3 != 0) {
    freeaddrinfo(_sock_fd);
    fprintf(_stderr,"%s ERROR: ",fileName);
    fprintf(_stderr,"getAddressInfo");
    fprintf(_stderr,"\n");
    exit(1);
  }
  iVar3 = socket(_sock_fd->ai_family,_sock_fd->ai_socktype,_sock_fd->ai_protocol);
  if (-1 < iVar3) {
    iVar4 = bind(iVar3,_sock_fd->ai_addr,_sock_fd->ai_addrlen);
    if (iVar4 < 0) {
      freeaddrinfo(_sock_fd);
      fprintf(_stderr,"%s ERROR: ",fileName);
      fprintf(_stderr,"bind");
      fprintf(_stderr,"\n");
      exit(1);
    }
    iVar4 = listen(iVar3,10);
    if (-1 < iVar4) {
      fprintf(_stderr,"http://localhost:%s ...\n",i_index);
      setupSignalHandler();
      startRequestHandling(iVar3,__name,rootDoc);
      freeaddrinfo(_sock_fd);
      return 0;
    }
    freeaddrinfo(_sock_fd);
    fprintf(_stderr,"%s ERROR: ",fileName);
    fprintf(_stderr,"listen");
    fprintf(_stderr,"\n");
    exit(1);
  }
  freeaddrinfo(_sock_fd);
  fprintf(_stderr,"%s ERROR: ",fileName);
  fprintf(_stderr,"socket");
  fprintf(_stderr,"\n");
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
	fileName = argv[0];
	int p=0;
	int i = 0;
	char * p_port = "8080";
	char * i_index = "index.html";
	char * rootDoc = "";

	int c;
	while ((c = getopt(argc, argv, "p:i:")) != -1) {
		switch (c) {
		case 'p':if (p) { USAGE(); }
				 p++;
				 p_port = strdup(optarg);
				 if (isValidPort(p_port) == 0) {
					 ERROR_EXIT("INVALID PORT");
				 }
				 break;
		case 'i':if (i) { USAGE(); }
				 i++;
				 i_index = strdup(optarg);
				 break;
		default:
			USAGE();
		}
	}

	if ((rootDoc = argv[optind]) == NULL) {
		USAGE();
	}
	if (-1==access(rootDoc, R_OK)) {
		ERROR_EXIT("root doc can't be read from");
	}


	struct addrinfo hints, *ai;
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_INET;
	hints.ai_socktype = SOCK_STREAM;
	hints.ai_flags = AI_PASSIVE;

	int res = getaddrinfo(NULL, p_port, &hints, &ai);
	if (res != 0) {
		freeaddrinfo(ai);
		ERROR_EXIT("getAddressInfo");
	}

	int sock_fd = socket(ai->ai_family, ai->ai_socktype, ai->ai_protocol);
	if (sock_fd < 0) {
		freeaddrinfo(ai);
		ERROR_EXIT("socket");
	}

	//int optval = 1;
	//setsockopt(sock_fd, SOL_SOCKET, SO_REUSEADDR, &optval, sizeof optval);

	if (bind(sock_fd, ai->ai_addr, ai->ai_addrlen) < 0) {
		freeaddrinfo(ai);
		ERROR_EXIT("bind");
	}

	if (listen(sock_fd, 10) < 0) {
		freeaddrinfo(ai);
		ERROR_EXIT("listen");
	}

	fprintf(stderr,"http://localhost:%s ...\n", p_port);
	setupSignalHandler();

	startRequestHandling(sock_fd,rootDoc,i_index);
	freeaddrinfo(ai);

	return 0;
}